

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.cpp
# Opt level: O2

void __thiscall CEditor::DoQuadPoint(CEditor *this,CQuad *pQuad,int QuadIndex,int V)

{
  CPoint *pCVar1;
  int *piVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  bool bVar7;
  char cVar8;
  int m_1;
  int iVar9;
  uint uVar10;
  long lVar11;
  byte bVar12;
  ulong uVar13;
  uint uVar14;
  long in_FS_OFFSET;
  float fVar15;
  float fVar16;
  float fVar18;
  int iVar19;
  CPoint CVar17;
  CPoint CVar20;
  CPoint CVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  float fVar24;
  undefined8 local_40;
  float local_38;
  float local_34;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar1 = pQuad->m_aPoints + V;
  uVar3 = (this->m_UI).m_MouseWorldX;
  uVar5 = (this->m_UI).m_MouseWorldY;
  fVar15 = (float)(*pCVar1).x * 0.0009765625;
  fVar18 = (float)(*pCVar1).y * 0.0009765625;
  fVar24 = (fVar15 - (float)uVar3) / this->m_WorldZoom;
  fVar16 = (fVar18 - (float)uVar5) / this->m_WorldZoom;
  if (fVar24 * fVar24 + fVar16 * fVar16 < 50.0) {
    (this->m_UI).m_pBecommingHotItem = pCVar1;
  }
  if ((this->m_SelectedQuad == QuadIndex) &&
     (((uint)this->m_SelectedPoints >> (V & 0x1fU) & 1) != 0)) {
    (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x21])();
    local_38 = this->m_WorldZoom * 7.0;
    local_40 = CONCAT44(fVar18,fVar15);
    local_34 = local_38;
    (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x1c])(this->m_pGraphics,&local_40,1);
  }
  iVar9 = (*(this->m_pInput->super_IInterface)._vptr_IInterface[4])();
  cVar8 = '\x01';
  if ((char)iVar9 == '\0') {
    iVar9 = (*(this->m_pInput->super_IInterface)._vptr_IInterface[4])();
    cVar8 = (char)iVar9;
  }
  bVar12 = (byte)V;
  if ((CPoint *)(this->m_UI).m_pActiveItem == pCVar1) {
    (this->m_UI).m_ActiveItemValid = true;
    uVar4 = this->m_MouseDeltaWx;
    uVar6 = this->m_MouseDeltaWy;
    if (DoQuadPoint(CQuad*,int,int)::s_Moved == '\0') {
      if (0.5 < (float)uVar4 * (float)uVar4 + (float)uVar6 * (float)uVar6) {
        DoQuadPoint(CQuad*,int,int)::s_Moved = '\x01';
        goto LAB_001886c6;
      }
      bVar7 = false;
LAB_001888b8:
      uVar14 = (this->m_UI).m_MouseButtons;
      if (DoQuadPoint::s_Operation == 3) {
        if ((uVar14 & 2) == 0) {
          CUI::DoPopupMenu(&this->m_UI,(int)(this->m_UI).m_MouseX,(int)(this->m_UI).m_MouseY,0x78,
                           0x96,this,PopupPoint,0xf);
LAB_00188a5e:
          (this->m_UI).m_ActiveItemValid = true;
          (this->m_UI).m_pActiveItem = (void *)0x0;
        }
      }
      else if ((uVar14 & 1) == 0) {
        if (!bVar7) {
          iVar9 = (*(this->m_pInput->super_IInterface)._vptr_IInterface[4])(this->m_pInput,0x161);
          if ((char)iVar9 == '\0') {
            iVar9 = (*(this->m_pInput->super_IInterface)._vptr_IInterface[4])(this->m_pInput,0x165);
            if ((char)iVar9 == '\0') {
              this->m_SelectedPoints = 1 << (bVar12 & 0x1f);
              goto LAB_00188a57;
            }
          }
          this->m_SelectedPoints = this->m_SelectedPoints ^ 1 << (bVar12 & 0x1f);
        }
LAB_00188a57:
        this->m_LockMouse = false;
        goto LAB_00188a5e;
      }
    }
    else {
LAB_001886c6:
      if (DoQuadPoint::s_Operation == 1) {
        uVar14 = this->m_SelectedPoints;
        if (cVar8 == '\0' && this->m_GridActive == true) {
          iVar9 = this->m_GridFactor;
          for (lVar11 = 0; lVar11 != 4; lVar11 = lVar11 + 1) {
            if ((uVar14 >> ((uint)lVar11 & 0x1f) & 1) != 0) {
              uVar10 = GetLineDistance(this);
              fVar16 = (float)(int)(iVar9 * (uVar10 >> 1));
              fVar24 = (float)(int)((uVar10 >> 1) * iVar9);
              auVar22._0_4_ =
                   (float)((uint)-fVar16 & -(uint)((float)uVar3 < 0.0) |
                          ~-(uint)((float)uVar3 < 0.0) & (uint)fVar16) + (float)uVar3;
              auVar22._4_4_ =
                   (float)((uint)-fVar24 & -(uint)((float)uVar5 < 0.0) |
                          ~-(uint)((float)uVar5 < 0.0) & (uint)fVar24) + (float)uVar5;
              auVar22._8_8_ = 0;
              auVar23._4_4_ = (float)(int)(iVar9 * uVar10);
              auVar23._0_4_ = (float)(int)(uVar10 * iVar9);
              auVar23._8_8_ = 0;
              auVar23 = divps(auVar22,auVar23);
              CVar17.x = (int)((float)(int)(uVar10 * iVar9 * (int)auVar23._0_4_) * 1024.0);
              CVar17.y = (int)((float)(int)((int)auVar23._4_4_ * iVar9 * uVar10) * 1024.0);
              pQuad->m_aPoints[lVar11] = CVar17;
            }
          }
        }
        else {
          for (lVar11 = 0; lVar11 != 4; lVar11 = lVar11 + 1) {
            if ((uVar14 >> ((uint)lVar11 & 0x1f) & 1) != 0) {
              CVar21.x = pQuad->m_aPoints[lVar11].x + (int)((float)uVar4 * 1024.0);
              CVar21.y = pQuad->m_aPoints[lVar11].y + (int)((float)uVar6 * 1024.0);
              pQuad->m_aPoints[lVar11] = CVar21;
            }
          }
        }
      }
      else {
        bVar7 = true;
        if (DoQuadPoint::s_Operation != 2) goto LAB_001888b8;
        uVar14 = this->m_SelectedPoints;
        iVar9 = (int)((float)uVar4 * 0.001 * 1024.0);
        iVar19 = (int)((float)uVar6 * 0.001 * 1024.0);
        for (uVar13 = 0; uVar13 != 4; uVar13 = uVar13 + 1) {
          if ((uVar14 >> ((uint)uVar13 & 0x1f) & 1) != 0) {
            CVar20.x = pQuad->m_aTexcoords[uVar13].x + iVar9;
            CVar20.y = pQuad->m_aTexcoords[uVar13].y + iVar19;
            pQuad->m_aTexcoords[uVar13] = CVar20;
            pQuad->m_aTexcoords[uVar13 ^ 2].x = pQuad->m_aTexcoords[uVar13 ^ 2].x + iVar9;
            piVar2 = &pQuad->m_aTexcoords[uVar13 ^ 1].y;
            *piVar2 = *piVar2 + iVar19;
          }
        }
      }
      if (((this->m_UI).m_MouseButtons & 1) == 0) goto LAB_00188a57;
    }
    iVar9 = this->m_pConfig->m_EdColorQuadPointActive;
  }
  else {
    if ((CPoint *)(this->m_UI).m_pHotItem == pCVar1) {
      ms_pUiGotContext = pCVar1;
      HexToRgba(this->m_pConfig->m_EdColorQuadPointHover);
      this->m_pTooltip =
           "Left mouse button to move. Hold shift to move the texture. Hold alt to ignore grid.";
      uVar14 = (this->m_UI).m_MouseButtons;
      if ((uVar14 & 1) == 0) {
        if ((uVar14 & 2) == 0) goto LAB_00188a79;
        DoQuadPoint::s_Operation = 3;
        this->m_SelectedQuad = QuadIndex;
        (this->m_UI).m_ActiveItemValid = true;
        (this->m_UI).m_pActiveItem = pCVar1;
        (this->m_UI).m_pLastActiveItem = pCVar1;
        uVar14 = 1 << (bVar12 & 0x1f);
        if (((uint)this->m_SelectedPoints >> (V & 0x1fU) & 1) != 0) goto LAB_00188a79;
        iVar9 = (*(this->m_pInput->super_IInterface)._vptr_IInterface[4])(this->m_pInput,0x161);
        if ((char)iVar9 == '\0') {
          iVar9 = (*(this->m_pInput->super_IInterface)._vptr_IInterface[4])(this->m_pInput,0x165);
          if ((char)iVar9 != '\0') goto LAB_001887e6;
        }
        else {
LAB_001887e6:
          uVar14 = uVar14 | this->m_SelectedPoints;
        }
        this->m_SelectedPoints = uVar14;
        DoQuadPoint(CQuad*,int,int)::s_Moved = '\x01';
        goto LAB_00188a79;
      }
      (this->m_UI).m_ActiveItemValid = true;
      (this->m_UI).m_pActiveItem = pCVar1;
      (this->m_UI).m_pLastActiveItem = pCVar1;
      DoQuadPoint(CQuad*,int,int)::s_Moved = '\0';
      iVar9 = (*(this->m_pInput->super_IInterface)._vptr_IInterface[4])(this->m_pInput,0x161);
      if ((char)iVar9 == '\0') {
        iVar9 = (*(this->m_pInput->super_IInterface)._vptr_IInterface[4])(this->m_pInput,0x165);
        if ((char)iVar9 != '\0') goto LAB_00188852;
        DoQuadPoint::s_Operation = 1;
      }
      else {
LAB_00188852:
        DoQuadPoint::s_Operation = 2;
        this->m_LockMouse = true;
      }
      uVar14 = 1 << (bVar12 & 0x1f);
      if (((uint)this->m_SelectedPoints >> (V & 0x1fU) & 1) == 0) {
        iVar9 = (*(this->m_pInput->super_IInterface)._vptr_IInterface[4])(this->m_pInput,0x161);
        if ((char)iVar9 == '\0') {
          iVar9 = (*(this->m_pInput->super_IInterface)._vptr_IInterface[4])(this->m_pInput,0x165);
          if ((char)iVar9 != '\0') goto LAB_00188b39;
        }
        else {
LAB_00188b39:
          uVar14 = uVar14 | this->m_SelectedPoints;
        }
        this->m_SelectedPoints = uVar14;
        DoQuadPoint(CQuad*,int,int)::s_Moved = '\x01';
      }
      this->m_SelectedQuad = QuadIndex;
      goto LAB_00188a79;
    }
    iVar9 = this->m_pConfig->m_EdColorQuadPoint;
  }
  HexToRgba(iVar9);
LAB_00188a79:
  (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x21])();
  local_38 = this->m_WorldZoom * 5.0;
  local_40 = CONCAT44(fVar18,fVar15);
  local_34 = local_38;
  (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x1c])(this->m_pGraphics,&local_40,1);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CEditor::DoQuadPoint(CQuad *pQuad, int QuadIndex, int V)
{
	void *pID = &pQuad->m_aPoints[V];

	float wx = UI()->MouseWorldX();
	float wy = UI()->MouseWorldY();

	float px = fx2f(pQuad->m_aPoints[V].x);
	float py = fx2f(pQuad->m_aPoints[V].y);

	float dx = (px - wx)/m_WorldZoom;
	float dy = (py - wy)/m_WorldZoom;
	if(dx*dx+dy*dy < 50)
		UI()->SetHotItem(pID);

	// draw selection background
	if(m_SelectedQuad == QuadIndex && m_SelectedPoints&(1<<V))
	{
		Graphics()->SetColor(0,0,0,1);
		IGraphics::CQuadItem QuadItem(px, py, 7.0f*m_WorldZoom, 7.0f*m_WorldZoom);
		Graphics()->QuadsDraw(&QuadItem, 1);
	}

	enum
	{
		OP_NONE=0,
		OP_MOVEPOINT,
		OP_MOVEUV,
		OP_CONTEXT_MENU
	};

	static bool s_Moved;
	static int s_Operation = OP_NONE;

	bool IgnoreGrid;
	if(Input()->KeyIsPressed(KEY_LALT) || Input()->KeyIsPressed(KEY_RALT))
		IgnoreGrid = true;
	else
		IgnoreGrid = false;

	vec4 pointColor;

	if(UI()->CheckActiveItem(pID))
	{
		float dx = m_MouseDeltaWx;
		float dy = m_MouseDeltaWy;
		if(!s_Moved)
		{
			if(dx*dx+dy*dy > 0.5f)
				s_Moved = true;
		}

		if(s_Moved)
		{
			if(s_Operation == OP_MOVEPOINT)
			{
				if(m_GridActive && !IgnoreGrid)
				{
					for(int m = 0; m < 4; m++)
						if(m_SelectedPoints&(1<<m))
						{
							int LineDistance = GetLineDistance();

							float x = 0.0f;
							float y = 0.0f;
							if(wx >= 0)
								x = (int)((wx+(LineDistance/2)*m_GridFactor)/(LineDistance*m_GridFactor)) * (LineDistance*m_GridFactor);
							else
								x = (int)((wx-(LineDistance/2)*m_GridFactor)/(LineDistance*m_GridFactor)) * (LineDistance*m_GridFactor);
							if(wy >= 0)
								y = (int)((wy+(LineDistance/2)*m_GridFactor)/(LineDistance*m_GridFactor)) * (LineDistance*m_GridFactor);
							else
								y = (int)((wy-(LineDistance/2)*m_GridFactor)/(LineDistance*m_GridFactor)) * (LineDistance*m_GridFactor);

							pQuad->m_aPoints[m].x = f2fx(x);
							pQuad->m_aPoints[m].y = f2fx(y);
						}
				}
				else
				{
					for(int m = 0; m < 4; m++)
						if(m_SelectedPoints&(1<<m))
						{
							pQuad->m_aPoints[m].x += f2fx(dx);
							pQuad->m_aPoints[m].y += f2fx(dy);
						}
				}
			}
			else if(s_Operation == OP_MOVEUV)
			{
				for(int m = 0; m < 4; m++)
					if(m_SelectedPoints&(1<<m))
					{
						// 0,2;1,3 - line x
						// 0,1;2,3 - line y

						pQuad->m_aTexcoords[m].x += f2fx(dx*0.001f);
						pQuad->m_aTexcoords[(m+2)%4].x += f2fx(dx*0.001f);

						pQuad->m_aTexcoords[m].y += f2fx(dy*0.001f);
						pQuad->m_aTexcoords[m^1].y += f2fx(dy*0.001f);
					}
			}
		}

		if(s_Operation == OP_CONTEXT_MENU)
		{
			if(!UI()->MouseButton(1))
			{
				UI()->DoPopupMenu(UI()->MouseX(), UI()->MouseY(), 120, 150, this, PopupPoint);
				UI()->SetActiveItem(0);
			}
		}
		else
		{
			if(!UI()->MouseButton(0))
			{
				if(!s_Moved)
				{
					if(Input()->KeyIsPressed(KEY_LSHIFT) || Input()->KeyIsPressed(KEY_RSHIFT))
						m_SelectedPoints ^= 1<<V;
					else
						m_SelectedPoints = 1<<V;
				}
				m_LockMouse = false;
				UI()->SetActiveItem(0);
			}
		}

		pointColor = HexToRgba(Config()->m_EdColorQuadPointActive);
	}
	else if(UI()->HotItem() == pID)
	{
		ms_pUiGotContext = pID;

		pointColor = HexToRgba(Config()->m_EdColorQuadPointHover);
		m_pTooltip = "Left mouse button to move. Hold shift to move the texture. Hold alt to ignore grid.";

		if(UI()->MouseButton(0))
		{
			UI()->SetActiveItem(pID);
			s_Moved = false;
			if(Input()->KeyIsPressed(KEY_LSHIFT) || Input()->KeyIsPressed(KEY_RSHIFT))
			{
				s_Operation = OP_MOVEUV;
				m_LockMouse = true;
			}
			else
				s_Operation = OP_MOVEPOINT;

			if(!(m_SelectedPoints&(1<<V)))
			{
				if(Input()->KeyIsPressed(KEY_LSHIFT) || Input()->KeyIsPressed(KEY_RSHIFT))
					m_SelectedPoints |= 1<<V;
				else
					m_SelectedPoints = 1<<V;
				s_Moved = true;
			}

			m_SelectedQuad = QuadIndex;
		}
		else if(UI()->MouseButton(1))
		{
			s_Operation = OP_CONTEXT_MENU;
			m_SelectedQuad = QuadIndex;
			UI()->SetActiveItem(pID);
			if(!(m_SelectedPoints&(1<<V)))
			{
				if(Input()->KeyIsPressed(KEY_LSHIFT) || Input()->KeyIsPressed(KEY_RSHIFT))
					m_SelectedPoints |= 1<<V;
				else
					m_SelectedPoints = 1<<V;
				s_Moved = true;
			}
		}
	}
	else
		pointColor = HexToRgba(Config()->m_EdColorQuadPoint);

	Graphics()->SetColor(pointColor.r, pointColor.g, pointColor.b, pointColor.a);
	IGraphics::CQuadItem QuadItem(px, py, 5.0f*m_WorldZoom, 5.0f*m_WorldZoom);
	Graphics()->QuadsDraw(&QuadItem, 1);
}